

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall
despot::Parser::IsSelfLoopingWithoutReward(Parser *this,vector<int,_std::allocator<int>_> *state)

{
  value_type vVar1;
  value_type pCVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  const_reference ppCVar9;
  uint *puVar10;
  const_reference pvVar11;
  size_type sVar12;
  reference __x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int local_40;
  int local_3c;
  int r;
  int s_1;
  int a;
  int s;
  _Self local_28;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *state_local;
  Parser *this_local;
  
  local_20 = state;
  state_local = (vector<int,_std::allocator<int>_> *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ::find(&this->selfloop_state_set_,state);
  _a = std::
       set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ::end(&this->selfloop_state_set_);
  bVar3 = std::operator!=(&local_28,(_Self *)&a);
  if (!bVar3) {
    for (s_1 = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(local_20),
        (ulong)(long)s_1 < sVar5; s_1 = s_1 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)s_1);
      vVar1 = *pvVar6;
      pvVar7 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                         (&this->prev_state_vars_,(long)s_1);
      (pvVar7->super_NamedVar).super_Variable.curr_value = vVar1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)s_1);
      vVar1 = *pvVar6;
      pvVar7 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                         (&this->curr_state_vars_,(long)s_1);
      (pvVar7->super_NamedVar).super_Variable.curr_value = vVar1;
    }
    r = 0;
    while( true ) {
      pvVar8 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                         (&this->action_vars_,0);
      iVar4 = Variable::Size(&pvVar8->super_Variable);
      if (iVar4 <= r) break;
      pvVar8 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                         (&this->action_vars_,0);
      (pvVar8->super_Variable).curr_value = r;
      for (local_3c = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(local_20),
          (ulong)(long)local_3c < sVar5; local_3c = local_3c + 1) {
        ppCVar9 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::operator[]
                            (&this->transition_funcs_,(long)local_3c);
        pCVar2 = *ppCVar9;
        puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                    (local_20,(long)local_3c);
        (*(pCVar2->super_Function)._vptr_Function[5])(pCVar2,(ulong)*puVar10);
        if ((extraout_XMM0_Qa != 1.0) || (NAN(extraout_XMM0_Qa))) {
          return false;
        }
      }
      for (local_40 = 0;
          sVar5 = std::vector<despot::Function,_std::allocator<despot::Function>_>::size
                            (&this->reward_funcs_), (ulong)(long)local_40 < sVar5;
          local_40 = local_40 + 1) {
        pvVar11 = std::vector<despot::Function,_std::allocator<despot::Function>_>::operator[]
                            (&this->reward_funcs_,(long)local_40);
        (*pvVar11->_vptr_Function[5])(pvVar11,0);
        if ((extraout_XMM0_Qa_00 != 0.0) || (NAN(extraout_XMM0_Qa_00))) {
          return false;
        }
      }
      r = r + 1;
    }
    if ((this->enable_selfloop_cache_ & 1U) != 0) {
      sVar12 = std::
               set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::size(&this->selfloop_state_set_);
      if (10000 < sVar12) {
        __x = std::
              queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
              ::front(&this->selfloop_state_queue_);
        std::
        set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::erase(&this->selfloop_state_set_,__x);
        std::
        queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
        ::pop(&this->selfloop_state_queue_);
      }
      std::
      set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::insert(&this->selfloop_state_set_,local_20);
      std::
      queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::push(&this->selfloop_state_queue_,local_20);
    }
  }
  return true;
}

Assistant:

bool Parser::IsSelfLoopingWithoutReward(const vector<int>& state) const {
	if (selfloop_state_set_.find(state) != selfloop_state_set_.end())
		return true;

	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
		curr_state_vars_[s].curr_value = state[s];
	}

	for (int a = 0; a < action_vars_[0].Size(); a++) {
		action_vars_[0].curr_value = a;

		for (int s = 0; s < state.size(); s++) {
			if (transition_funcs_[s]->GetValue(state[s]) != 1.0)
				return false;
		}

		for (int r = 0; r < reward_funcs_.size(); r++) {
			if (reward_funcs_[r].GetValue() != 0)
				return false;
		}
	}

	if (enable_selfloop_cache_) {
		if (selfloop_state_set_.size() > 10000) { // Replace the oldest state by the new one
			selfloop_state_set_.erase(selfloop_state_queue_.front());
			selfloop_state_queue_.pop();
		}

		selfloop_state_set_.insert(state);
		selfloop_state_queue_.push(state);
	}

	return true;
}